

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialect_detection.cpp
# Opt level: O1

bool __thiscall
duckdb::CSVSniffer::RefineCandidateNextChunk(CSVSniffer *this,ColumnCountScanner *candidate)

{
  bool ignore_errors;
  vector<duckdb::LogicalType,_true> *pvVar1;
  idx_t iVar2;
  int iVar3;
  undefined4 extraout_var;
  reference pvVar4;
  ulong uVar5;
  size_type __n;
  vector<duckdb::ColumnCount,_true> *this_00;
  bool bVar6;
  bool bVar7;
  
  iVar3 = (*(candidate->super_BaseScanner)._vptr_BaseScanner[2])(candidate);
  uVar5 = CONCAT44(extraout_var,iVar3);
  bVar7 = *(long *)(uVar5 + 0x68) == 0;
  if (!bVar7) {
    this_00 = (vector<duckdb::ColumnCount,_true> *)(uVar5 + 0x40);
    __n = 0;
    do {
      pvVar1 = (this->set_columns).types;
      if ((pvVar1 != (vector<duckdb::LogicalType,_true> *)0x0) &&
         ((pvVar1->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pvVar1->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        pvVar4 = vector<duckdb::ColumnCount,_true>::operator[](this_00,__n);
        iVar2 = pvVar4->number_of_columns;
        bVar6 = this->options->null_padding;
        ignore_errors = (this->options->ignore_errors).value;
        pvVar4 = vector<duckdb::ColumnCount,_true>::operator[](this_00,__n);
        bVar6 = SetColumns::IsCandidateUnacceptable
                          (&this->set_columns,iVar2,bVar6,ignore_errors,
                           pvVar4->last_value_always_empty);
        uVar5 = (ulong)!bVar6;
        goto LAB_00b98ea6;
      }
      iVar2 = this->max_columns_found;
      pvVar4 = vector<duckdb::ColumnCount,_true>::operator[](this_00,__n);
      if ((((iVar2 != pvVar4->number_of_columns) && (this->options->null_padding == false)) &&
          ((this->options->ignore_errors).value == false)) &&
         (pvVar4 = vector<duckdb::ColumnCount,_true>::operator[](this_00,__n),
         pvVar4->is_comment != true)) break;
      __n = __n + 1;
      bVar6 = __n < *(ulong *)(uVar5 + 0x68);
      bVar7 = !bVar6;
    } while (bVar6);
    uVar5 = 0;
  }
LAB_00b98ea6:
  return (bool)(bVar7 | (byte)uVar5 & 1);
}

Assistant:

bool CSVSniffer::RefineCandidateNextChunk(ColumnCountScanner &candidate) const {
	auto &sniffed_column_counts = candidate.ParseChunk();
	for (idx_t i = 0; i < sniffed_column_counts.result_position; i++) {
		if (set_columns.IsSet()) {
			return !set_columns.IsCandidateUnacceptable(sniffed_column_counts[i].number_of_columns,
			                                            options.null_padding, options.ignore_errors.GetValue(),
			                                            sniffed_column_counts[i].last_value_always_empty);
		}
		if (max_columns_found != sniffed_column_counts[i].number_of_columns &&
		    (!options.null_padding && !options.ignore_errors.GetValue() && !sniffed_column_counts[i].is_comment)) {
			return false;
		}
	}
	return true;
}